

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackTraceGnu-inl.cpp
# Opt level: O0

BackTraceSymbol __thiscall
cppassert::internal::BackTraceSymbol::createFromBacktraceStr
          (BackTraceSymbol *this,char *backTraceSymbol,CppDemangler *demangler)

{
  char *pcVar1;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  BackTraceSymbol BVar2;
  char *demangledSymbol;
  char *local_40;
  char *endOffset;
  char *beginOffset;
  char *beginName;
  CppDemangler *local_20;
  CppDemangler *demangler_local;
  char *backTraceSymbol_local;
  BackTraceSymbol *result;
  
  beginName._7_1_ = 0;
  local_20 = demangler;
  demangler_local = (CppDemangler *)backTraceSymbol;
  backTraceSymbol_local = (char *)this;
  BackTraceSymbol(this);
  beginOffset = (char *)0x0;
  endOffset = (char *)0x0;
  local_40 = (char *)0x0;
  findSymbolInBacktraceStr((char *)demangler_local,&beginOffset,&endOffset,&local_40);
  if ((((beginOffset == (char *)0x0) || (endOffset == (char *)0x0)) || (local_40 == (char *)0x0)) ||
     (endOffset <= beginOffset)) {
    setSymbol(this,(char *)demangler_local);
    pcVar1 = extraout_RDX_01;
  }
  else {
    pcVar1 = beginOffset + 1;
    *beginOffset = '\0';
    *endOffset = '\0';
    endOffset = endOffset + 1;
    beginOffset = pcVar1;
    pcVar1 = CppDemangler::demangle(local_20,pcVar1);
    if (pcVar1 == (char *)0x0) {
      beginOffset = beginOffset + -1;
      endOffset = endOffset + -1;
      *beginOffset = '(';
      *endOffset = '+';
      setSymbol(this,(char *)demangler_local);
      pcVar1 = extraout_RDX_00;
    }
    else {
      setSymbol(this,(char *)demangler_local,pcVar1,endOffset);
      pcVar1 = extraout_RDX;
    }
  }
  BVar2.allocated_ = pcVar1;
  BVar2.symbol_ = (char *)this;
  return BVar2;
}

Assistant:

static BackTraceSymbol createFromBacktraceStr(char *backTraceSymbol
                                        , CppDemangler *demangler)
    {
        BackTraceSymbol result;
        char *beginName = 0, *beginOffset = 0, *endOffset = 0;
        findSymbolInBacktraceStr(backTraceSymbol
                                , &beginName
                                , &beginOffset
                                , &endOffset);

        if (beginName
            && beginOffset
            && endOffset
	    && beginName < beginOffset)
	{
	    *beginName++ = '\0';
            *beginOffset++ = '\0';
            const char *demangledSymbol = demangler->demangle(beginName);
            if(demangledSymbol)
            {
                result.setSymbol(backTraceSymbol, demangledSymbol, beginOffset);
            }
            else
            {
                //restore previous state
                --beginName;
                --beginOffset;
                *beginName = '(';
                *beginOffset = '+';
                result.setSymbol(backTraceSymbol);
            }
        }
        else
        {
            result.setSymbol(backTraceSymbol);
        }

        return result;
    }